

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O1

Vec2 __thiscall Randomizer::randPosition(Randomizer *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uniform_real_distribution<float> *puVar4;
  Vec2 VVar5;
  float fVar6;
  float fVar7;
  
  puVar4 = this->XAxisRnd;
  fVar6 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (this->RndCore);
  fVar1 = (puVar4->_M_param)._M_a;
  fVar2 = (puVar4->_M_param)._M_b;
  puVar4 = this->YAxisRnd;
  fVar7 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (this->RndCore);
  fVar3 = (puVar4->_M_param)._M_a;
  VVar5.y = ((puVar4->_M_param)._M_b - fVar3) * fVar7 + fVar3;
  VVar5.x = fVar6 * (fVar2 - fVar1) + fVar1;
  return VVar5;
}

Assistant:

Vec2 Randomizer::randPosition()
{
    return Vec2(randXAxis(), randYAxis());
}